

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O2

RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_> *
__thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::_leftMove
          (RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this,
          RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
          *node)

{
  bool bVar1;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar2;
  
  if ((node->_is_red == true) &&
     ((node->_left ==
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0 || (node->_left->_is_red == false)))) {
    if ((node->_right !=
         (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
          *)0x0) && (node->_right->_is_red == true)) {
      pRVar2 = _leftRotate(this,node);
      return pRVar2;
    }
    bVar1 = _flipColors(this,node);
    if (bVar1) {
      pRVar2 = node->_right->_left;
      if ((pRVar2 != (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                      *)0x0) && (pRVar2->_is_red == true)) {
        _rightRotate(this,node->_right);
        node = _leftRotate(this,node);
        _flipColors(this,node);
      }
    }
  }
  return node;
}

Assistant:

inline
    RBTreeNode<TreeElement<Key, Value>>* RBTree<Key, Value>::_leftMove(RBTreeNode<TreeElement<Key, Value>> *node){
        if (!node->isRed()) {
            return node;
        }
        if (node->left() != nullptr && node->left()->isRed()) {
            return node;
        }
        if (node->right() != nullptr && node->right()->isRed()) {
            node = _leftRotate(node);
            return node;
        }
        if (!_flipColors(node)) {
            return node;
        }
        // if node is red, left and right nodes are not red
        auto right = node->right();
        if (right->left() == nullptr || !right->left()->isRed()) {
            return node;
        }
        _rightRotate(right);
        node = _leftRotate(node);
        _flipColors(node);
        return node;
    }